

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O1

Pafs * kj::anon_unknown_0::makeCompletionCountingPafs
                 (Pafs *__return_storage_ptr__,uint count,uint *tasksCompleted)

{
  PromiseArena *pPVar1;
  OwnPromiseNode node;
  PromiseArenaMember *pPVar2;
  Promise<void> *pPVar3;
  WeakFulfiller<void> *params;
  void *pvVar4;
  TransformPromiseNodeBase *this;
  undefined4 in_register_00000034;
  int iVar5;
  ArrayBuilder<kj::Promise<void>_> promisesBuilder;
  Array<kj::Promise<void>_> *result;
  PromiseFulfillerPair<void> paf;
  ArrayBuilder<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> fulfillersBuilder;
  Promise<void> *pPVar6;
  OwnPromiseNode local_70;
  WeakFulfillerBase *local_68;
  WeakFulfiller<void> *local_60;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_58;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_50;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_48;
  ArrayDisposer *local_40;
  PromiseArenaMember *local_38;
  
  pPVar3 = (Promise<void> *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (8,0,5,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pPVar6 = pPVar3;
  local_58 = (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)
             kj::_::HeapArrayDisposer::allocateImpl
                       (0x10,0,5,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_48 = local_58 + 5;
  local_40 = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  iVar5 = 5;
  local_50 = local_58;
  do {
    params = (WeakFulfiller<void> *)operator_new(0x18);
    (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
    (params->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector =
         (_func_int **)&PTR_reject_00629ab8;
    (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
         (_func_int **)&PTR_disposeImpl_00629af0;
    kj::_::PromiseDisposer::
    alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<void>&>
              ((PromiseDisposer *)&local_38,params);
    pPVar2 = local_38;
    local_70.ptr = (PromiseNode *)local_38;
    pPVar1 = local_38->arena;
    local_68 = &params->super_WeakFulfillerBase;
    local_60 = params;
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_38 - (long)pPVar1) < 0x28) {
      pvVar4 = operator_new(0x400);
      this = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this,&local_70,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:838:42)>
                 ::anon_class_8_1_78461c9b_for_func::operator());
      *(undefined ***)((long)pvVar4 + 0x3d8) = &PTR_destroy_006278f0;
      *(PromiseArena **)((long)pvVar4 + 0x3f8) =
           (PromiseArena *)CONCAT44(in_register_00000034,count);
      *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
    }
    else {
      local_38->arena = (PromiseArena *)0x0;
      this = (TransformPromiseNodeBase *)&local_38[-3].arena;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this,&local_70,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:838:42)>
                 ::anon_class_8_1_78461c9b_for_func::operator());
      pPVar2[-3].arena = (PromiseArena *)&PTR_destroy_006278f0;
      pPVar2[-1].arena = (PromiseArena *)CONCAT44(in_register_00000034,count);
      pPVar2[-2]._vptr_PromiseArenaMember = (_func_int **)pPVar1;
    }
    node.ptr = local_70.ptr;
    (pPVar6->super_PromiseBase).node.ptr = &this->super_PromiseNode;
    pPVar6 = pPVar6 + 1;
    local_50->disposer = &local_68->super_Disposer;
    local_50->ptr = &local_60->super_PromiseFulfiller<void>;
    local_60 = (WeakFulfiller<void> *)0x0;
    local_50 = local_50 + 1;
    if (&(local_70.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_70.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
    }
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  (__return_storage_ptr__->promises).ptr = pPVar3;
  (__return_storage_ptr__->promises).size_ = (long)pPVar6 - (long)pPVar3 >> 3;
  (__return_storage_ptr__->promises).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance
  ;
  (__return_storage_ptr__->fulfillers).ptr = local_58;
  (__return_storage_ptr__->fulfillers).size_ = (long)local_50 - (long)local_58 >> 4;
  (__return_storage_ptr__->fulfillers).disposer = local_40;
  return __return_storage_ptr__;
}

Assistant:

Pafs makeCompletionCountingPafs(uint count, uint& tasksCompleted) {
  auto promisesBuilder = heapArrayBuilder<Promise<void>>(count);
  auto fulfillersBuilder = heapArrayBuilder<Own<PromiseFulfiller<void>>>(count);

  for (auto KJ_UNUSED value: zeroTo(count)) {
    auto paf = newPromiseAndFulfiller<void>();
    promisesBuilder.add(paf.promise.then([&tasksCompleted]() {
      ++tasksCompleted;
    }));
    fulfillersBuilder.add(kj::mv(paf.fulfiller));
  }

  return { promisesBuilder.finish(), fulfillersBuilder.finish() };
}